

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::deleteAll<std::vector<Catch::IGeneratorInfo*,std::allocator<Catch::IGeneratorInfo*>>>
               (vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_> *container
               )

{
  bool bVar1;
  reference ppIVar2;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
  local_10 [2];
  
  std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>::begin
            (in_stack_ffffffffffffffc8);
  __gnu_cxx::
  __normal_iterator<Catch::IGeneratorInfo*const*,std::vector<Catch::IGeneratorInfo*,std::allocator<Catch::IGeneratorInfo*>>>
  ::__normal_iterator<Catch::IGeneratorInfo**>
            (in_stack_ffffffffffffffd0,
             (__normal_iterator<Catch::IGeneratorInfo_**,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
              *)in_stack_ffffffffffffffc8);
  std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>::end
            (in_stack_ffffffffffffffc8);
  __gnu_cxx::
  __normal_iterator<Catch::IGeneratorInfo*const*,std::vector<Catch::IGeneratorInfo*,std::allocator<Catch::IGeneratorInfo*>>>
  ::__normal_iterator<Catch::IGeneratorInfo**>
            (in_stack_ffffffffffffffd0,
             (__normal_iterator<Catch::IGeneratorInfo_**,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
              *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
              ::operator*(local_10);
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
          *)*ppIVar2;
    if (in_stack_ffffffffffffffd0 !=
        (__normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
         *)0x0) {
      (*(code *)in_stack_ffffffffffffffd0->_M_current[1])();
    }
    __gnu_cxx::
    __normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
    ::operator++(local_10);
  }
  return;
}

Assistant:

inline void deleteAll( ContainerT& container ) {
        typename ContainerT::const_iterator it = container.begin();
        typename ContainerT::const_iterator itEnd = container.end();
        for(; it != itEnd; ++it )
            delete *it;
    }